

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::insertLayout(QBoxLayout *this,int index,QLayout *layout,int stretch)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  parameter_type t;
  QLayoutItem *pQVar3;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,layout);
  if (bVar1) {
    bVar1 = QLayout::adoptLayout(&this->super_QLayout,layout);
    if (bVar1) {
      iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
      t = (parameter_type)operator_new(0x10);
      pQVar3 = &layout->super_QLayoutItem;
      if (layout == (QLayout *)0x0) {
        pQVar3 = (QLayoutItem *)0x0;
      }
      t->item = pQVar3;
      t->stretch = stretch;
      t->magic = false;
      QList<QBoxLayoutItem_*>::insert(&this_00->list,(long)iVar2,t);
      (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
      return;
    }
  }
  return;
}

Assistant:

void QBoxLayout::insertLayout(int index, QLayout *layout, int stretch)
{
    Q_D(QBoxLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(layout, stretch);
    d->list.insert(index, it);
    invalidate();
}